

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O3

char * get_ptypes(short *S,vrna_md_t *md,uint idx_type)

{
  int iVar1;
  char *pcVar2;
  int *__ptr;
  long lVar3;
  long lVar4;
  ulong uVar5;
  short *psVar6;
  short *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint length;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  
  if (S == (short *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    length = (uint)*S;
    if (*S < 0) {
      pcVar2 = (char *)0x0;
      vrna_message_warning
                ("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                 (ulong)length);
    }
    else {
      if (idx_type == 0) {
        pcVar2 = vrna_ptypes(S,md);
        return pcVar2;
      }
      pcVar2 = (char *)vrna_alloc(((length + 1) * length >> 1) + 2);
      __ptr = vrna_idx_row_wise(length);
      iVar1 = md->min_loop_size;
      if (1 < (int)(length - iVar1)) {
        lVar8 = (long)(iVar1 + 2);
        lVar10 = (long)(int)length;
        psVar6 = S + lVar8;
        lVar13 = (long)pcVar2 - lVar8;
        uVar5 = 1;
        do {
          psVar6 = psVar6 + 1;
          lVar19 = 1;
          psVar7 = psVar6;
          lVar9 = lVar8;
          lVar14 = lVar13;
          do {
            lVar3 = (long)iVar1 + uVar5 + lVar19;
            if (lVar3 <= lVar10) {
              lVar4 = 0;
              iVar11 = 0;
              iVar18 = 0;
              uVar15 = uVar5;
              lVar17 = lVar14;
              iVar16 = md->pair[S[uVar5]][S[lVar3]];
              do {
                lVar3 = lVar9 + lVar4;
                if ((1 < uVar15) && (lVar3 < lVar10)) {
                  iVar18 = md->pair[S[uVar15 - 1]][psVar7[lVar4]];
                }
                iVar12 = 0;
                if (iVar11 != 0 || iVar18 != 0) {
                  iVar12 = iVar16;
                }
                iVar11 = iVar12;
                if (md->noLP == 0) {
                  iVar11 = iVar16;
                }
                *(char *)(lVar17 + __ptr[uVar15]) = (char)iVar11;
                if ((long)uVar15 < 2) break;
                uVar15 = uVar15 - 1;
                lVar4 = lVar4 + 1;
                lVar17 = lVar17 + -1;
                iVar16 = iVar18;
              } while (lVar3 < lVar10);
            }
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 1;
            psVar7 = psVar7 + 1;
            lVar14 = lVar14 + -1;
          } while (lVar19 != 3);
          uVar5 = uVar5 + 1;
          lVar8 = lVar8 + 1;
          lVar13 = lVar13 + -1;
        } while (uVar5 != length - iVar1);
      }
      free(__ptr);
    }
  }
  return pcVar2;
}

Assistant:

PUBLIC char *
get_ptypes(const short  *S,
           vrna_md_t    *md,
           unsigned int idx_type)
{
  if (S) {
    if ((unsigned int)S[0] > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
      vrna_message_warning("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                           (int)S[0]);
      return NULL;
    }

    if (idx_type)
      return wrap_get_ptypes(S, md);
    else
      return vrna_ptypes(S, md);
  } else {
    return NULL;
  }
}